

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall CGL::RaytracedRenderer::update_screen(RaytracedRenderer *this)

{
  ulong uVar1;
  ulong uVar2;
  reference pvVar3;
  long in_RDI;
  RaytracedRenderer *in_stack_00000010;
  RaytracedRenderer *in_stack_00000220;
  
  switch(*(undefined4 *)(in_RDI + 0x38)) {
  case 0:
  case 1:
    break;
  case 2:
    visualize_accel(in_stack_00000220);
    break;
  case 3:
    uVar1 = *(ulong *)(in_RDI + 0xe0);
    uVar2 = *(ulong *)(in_RDI + 0xe8);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xf0),0);
    glDrawPixels(uVar1 & 0xffffffff,uVar2 & 0xffffffff,0x1908,0x1401,pvVar3);
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      visualize_cell(in_stack_00000010);
    }
    break;
  case 4:
    uVar1 = *(ulong *)(in_RDI + 0xe0);
    uVar2 = *(ulong *)(in_RDI + 0xe8);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xf0),0);
    glDrawPixels(uVar1 & 0xffffffff,uVar2 & 0xffffffff,0x1908,0x1401,pvVar3);
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      visualize_cell(in_stack_00000010);
    }
  }
  return;
}

Assistant:

void RaytracedRenderer::update_screen() {
  switch (state) {
    case INIT:
    case READY:
      break;
    case VISUALIZE:
      visualize_accel();
      break;
    case RENDERING:
      glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
                   GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
      if (render_cell)
        visualize_cell();
      break;
    case DONE:
      glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
                   GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
      if (render_cell)
        visualize_cell();
      break;
  }
}